

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_er_1(m68k_info *info,int opcode,uint8_t size)

{
  undefined7 in_register_00000011;
  m68k_cpu_size size_00;
  
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  size_00 = (m68k_cpu_size)CONCAT71(in_register_00000011,size);
  (info->extension).op_size.field_1.cpu_size = size_00;
  get_ea_mode_op(info,(info->extension).operands,info->ir,size_00);
  (info->extension).operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  (info->extension).operands[1].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void build_er_1(m68k_info *info, int opcode, uint8_t size)
{
	build_er_gen_1(info, true, opcode, size);
}